

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanFlowEntry(Scanner *this)

{
  bool bVar1;
  reference pvVar2;
  Stream *in_RDI;
  Mark mark;
  value_type *in_stack_fffffffffffffed8;
  int n;
  Stream *__x;
  Stream *in_stack_fffffffffffffee0;
  Token *this_00;
  undefined8 in_stack_fffffffffffffee8;
  TYPE type_;
  Scanner *in_stack_fffffffffffffef0;
  Scanner *in_stack_ffffffffffffff18;
  
  type_ = (TYPE)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  bVar1 = InFlowContext((Scanner *)0xf20331);
  if (bVar1) {
    pvVar2 = std::
             stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
             ::top((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
                    *)0xf2034b);
    if ((*pvVar2 == FLOW_MAP) && (bVar1 = VerifySimpleKey(in_stack_ffffffffffffff18), bVar1)) {
      type_ = (TYPE)((ulong)(in_RDI + 1) >> 0x20);
      YAML::Stream::mark(in_RDI);
      in_stack_fffffffffffffef0 = (Scanner *)&stack0xffffffffffffffa0;
      Token::Token((Token *)in_stack_fffffffffffffef0,type_,(Mark *)in_stack_fffffffffffffee0);
      std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
                ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      Token::~Token((Token *)in_stack_fffffffffffffee0);
    }
    else {
      pvVar2 = std::
               stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
               ::top((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
                      *)0xf20420);
      if (*pvVar2 == FLOW_SEQ) {
        InvalidateSimpleKey(in_stack_fffffffffffffef0);
      }
    }
  }
  n = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 1;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  YAML::Stream::mark(in_RDI);
  YAML::Stream::eat(in_stack_fffffffffffffee0,n);
  __x = in_RDI + 1;
  this_00 = (Token *)&stack0xffffffffffffff00;
  Token::Token((Token *)in_stack_fffffffffffffef0,type_,(Mark *)this_00);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_00,
             (value_type *)__x);
  Token::~Token(this_00);
  return;
}

Assistant:

void Scanner::ScanFlowEntry() {
  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::FLOW_ENTRY, mark));
}